

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O1

char * __thiscall FParser::GetTokens(FParser *this,char *s)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  size_t sVar4;
  byte *pbVar5;
  byte bVar6;
  byte *__s;
  
  this->Rover = s;
  this->NumTokens = 1;
  *this->Tokens[0] = '\0';
  this->TokenType[(long)this->NumTokens + -1] = name_;
  this->Section = (DFsSection *)0x0;
  NextToken(this);
  this->LineStart = this->Rover;
  if (*this->Rover == '\0') {
    __s = (byte *)0x0;
  }
  else {
    lVar3 = (long)this->NumTokens;
    __s = (byte *)this->Tokens[lVar3 + -1];
    if (this->Section == (DFsSection *)0x0) {
LAB_00511b96:
      if (this->TokenType[lVar3 + -1] == string_) {
switchD_00511bc5_caseD_3:
        do {
          pbVar5 = (byte *)this->Rover;
          bVar6 = *pbVar5;
          if (bVar6 == 0x5c) {
            this->Rover = (char *)(pbVar5 + 1);
            bVar6 = pbVar5[1];
            if ((byte)(bVar6 - 0x30) < 10) {
              sVar4 = strlen((char *)__s);
              (__s + sVar4)[0] = 0x1c;
              (__s + sVar4)[1] = 0;
              bVar6 = *this->Rover + 0x11;
            }
            else if (0x60 < bVar6) {
              if (bVar6 == 0x61) {
                bVar6 = 7;
              }
              else if (bVar6 == 0x6e) {
                bVar6 = 10;
              }
              else if (bVar6 == 0x74) {
                bVar6 = 9;
              }
            }
          }
          else if (bVar6 == 0x22) goto code_r0x00511cc0;
          sVar4 = strlen((char *)__s);
          __s[sVar4] = bVar6;
          __s[sVar4 + 1] = 0;
          this->Rover = this->Rover + 1;
        } while( true );
      }
      if (*this->Rover != ';') {
        switch(this->TokenType[lVar3 + -1]) {
        case name_:
          pbVar5 = (byte *)this->Rover;
          bVar6 = *pbVar5;
          while (((uVar2 = (uint)(char)bVar6, uVar2 == 0x5f || (0xfffffff5 < uVar2 - 0x3a)) ||
                 (0xffffffe5 < (uVar2 & 0xffffffdf) - 0x5b))) {
            this->Rover = (char *)(pbVar5 + 1);
            bVar6 = *pbVar5;
            sVar4 = strlen((char *)__s);
            __s[sVar4] = bVar6;
            __s[sVar4 + 1] = 0;
            pbVar5 = (byte *)this->Rover;
            bVar6 = *pbVar5;
          }
          break;
        case number:
          pbVar5 = (byte *)this->Rover;
          if (*pbVar5 == 0x2e || (byte)(*pbVar5 - 0x30) < 10) {
            do {
              this->Rover = (char *)(pbVar5 + 1);
              bVar6 = *pbVar5;
              sVar4 = strlen((char *)__s);
              __s[sVar4] = bVar6;
              __s[sVar4 + 1] = 0;
              pbVar5 = (byte *)this->Rover;
            } while (*pbVar5 == 0x2e || (byte)(*pbVar5 - 0x30) < 10);
          }
          break;
        case operator_:
          bVar6 = *__s;
          if (bVar6 != 0) {
            if (((bVar6 & 0xfe) == 0x28) || (*this->Rover != 0x3d && *this->Rover != bVar6)) break;
          }
          bVar6 = *this->Rover;
          sVar4 = strlen((char *)__s);
          __s[sVar4] = bVar6;
          __s[sVar4 + 1] = 0;
        default:
          this->Rover = this->Rover + 1;
          goto LAB_00511ccf;
        case string_:
        case unset:
          goto switchD_00511bc5_caseD_3;
        }
        goto LAB_00511cc7;
      }
    }
  }
LAB_00511d8d:
  if ((__s == (byte *)0x0) || (*__s == 0)) {
    this->NumTokens = this->NumTokens + -1;
  }
  pcVar1 = this->Rover;
  this->Rover = pcVar1 + 1;
  return pcVar1 + 1;
code_r0x00511cc0:
  this->Rover = (char *)(pbVar5 + 1);
LAB_00511cc7:
  NextToken(this);
LAB_00511ccf:
  lVar3 = (long)this->NumTokens;
  __s = (byte *)this->Tokens[lVar3 + -1];
  if (this->Section != (DFsSection *)0x0) goto LAB_00511d8d;
  goto LAB_00511b96;
}

Assistant:

char *FParser::GetTokens(char *s)
{
	char *tokn = NULL;

	Rover = s;
	NumTokens = 1;
	Tokens[0][0] = 0; TokenType[NumTokens-1] = name_;
	
	Section = NULL;   // default to no section found
	
	NextToken();
	LineStart = Rover;      // save the start
	
	if(*Rover)
	{
		while(1)
		{
			tokn = Tokens[NumTokens-1];
			if(Section)
			{
				// a { or } section brace has been found
				break;        // stop parsing now
			}
			else if(TokenType[NumTokens-1] != string_)
			{
				if(*Rover == ';') break;     // check for end of command ';'
			}
			
			switch(TokenType[NumTokens-1])
			{
			case unset:
			case string_:
				while(*Rover != '\"')     // dedicated loop for speed
				{
					if(*Rover == '\\')       // escape sequences
					{
						Rover++;
						if (*Rover>='0' && *Rover<='9')
						{
							add_char(tokn, TEXTCOLOR_ESCAPE);
							add_char(tokn, *Rover+'A'-'0');
						}
						else add_char(tokn, escape_sequence(*Rover));
					}
					else
						add_char(tokn, *Rover);
					Rover++;
				}
				Rover++;
				NextToken();       // end of this token
				continue;
				
			case operator_:
				// all 2-character operators either end in '=' or
				// are 2 of the same character
				// do not allow 2-characters for brackets '(' ')'
				// which are still being considered as operators
				
				// operators are only 2-char max, do not need
				// a seperate loop
				
				if((*tokn && *Rover != '=' && *Rover!=*tokn) ||
					*tokn == '(' || *tokn == ')')
				{
					// end of operator
					NextToken();
					continue;
				}
				add_char(tokn, *Rover);
				break;
				
			case number:
				
				// haleyjd: 8-17
				// add while number chars are read
				
				while(isnum(*Rover))       // dedicated loop
					add_char(tokn, *Rover++);
				NextToken();
				continue;
				
			case name_:
				
				// add the chars
				
				while(!isop(*Rover))        // dedicated loop
					add_char(tokn, *Rover++);
				NextToken();
				continue;
				
			default:
				break;
			}
			Rover++;
		}
	}
		
	// check for empty last token
	
	if(!tokn || !tokn[0])
	{
		NumTokens = NumTokens - 1;
	}
	
	Rover++;
	return Rover;
}